

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O0

void Aig_TableInsert(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t **ppPlace;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0xb0,"void Aig_TableInsert(Aig_Man_t *, Aig_Obj_t *)");
  }
  pAVar3 = Aig_TableLookup(p,pObj);
  if (pAVar3 == (Aig_Obj_t *)0x0) {
    if ((pObj->Id & 0xffU) == 0) {
      iVar1 = p->nTableSize;
      iVar2 = Aig_ManNodeNum(p);
      if (iVar1 << 1 < iVar2) {
        Aig_TableResize(p);
      }
    }
    ppAVar4 = Aig_TableFind(p,pObj);
    if (*ppAVar4 == (Aig_Obj_t *)0x0) {
      *ppAVar4 = pObj;
      return;
    }
    __assert_fail("*ppPlace == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0xb5,"void Aig_TableInsert(Aig_Man_t *, Aig_Obj_t *)");
  }
  __assert_fail("Aig_TableLookup(p, pObj) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                ,0xb1,"void Aig_TableInsert(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_TableInsert( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t ** ppPlace;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_TableLookup(p, pObj) == NULL );
    if ( (pObj->Id & 0xFF) == 0 && 2 * p->nTableSize < Aig_ManNodeNum(p) )
        Aig_TableResize( p );
    ppPlace = Aig_TableFind( p, pObj );
    assert( *ppPlace == NULL );
    *ppPlace = pObj;
}